

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int session_send_disposition(LINK_ENDPOINT_HANDLE link_endpoint,DISPOSITION_HANDLE disposition)

{
  int iVar1;
  AMQP_VALUE performative;
  undefined1 uVar2;
  undefined7 in_register_00000009;
  PAYLOAD *payloads;
  int iVar3;
  
  uVar2 = disposition == (DISPOSITION_HANDLE)0x0 || link_endpoint == (LINK_ENDPOINT_HANDLE)0x0;
  iVar3 = 0x560;
  if (disposition != (DISPOSITION_HANDLE)0x0 && link_endpoint != (LINK_ENDPOINT_HANDLE)0x0) {
    performative = amqpvalue_create_disposition(disposition);
    if (performative == (AMQP_VALUE)0x0) {
      iVar3 = 0x567;
    }
    else {
      iVar1 = encode_frame(link_endpoint,performative,payloads,CONCAT71(in_register_00000009,uVar2))
      ;
      iVar3 = 0x56d;
      if (iVar1 == 0) {
        iVar3 = 0;
      }
      amqpvalue_destroy(performative);
    }
  }
  return iVar3;
}

Assistant:

int session_send_disposition(LINK_ENDPOINT_HANDLE link_endpoint, DISPOSITION_HANDLE disposition)
{
    int result;

    if ((link_endpoint == NULL) ||
        (disposition == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE disposition_performative_value = amqpvalue_create_disposition(disposition);
        if (disposition_performative_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (encode_frame(link_endpoint, disposition_performative_value, NULL, 0) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(disposition_performative_value);
        }
    }

    return result;
}